

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool check_owner_password_V5(string *owner_password,EncryptionData *data)

{
  __type_conflict1 _Var1;
  string *psVar2;
  string local_c8;
  undefined1 local_a8 [8];
  string password;
  string validation_salt;
  undefined1 local_58 [8];
  string owner_data;
  string user_data;
  EncryptionData *data_local;
  string *owner_password_local;
  
  psVar2 = QPDF::EncryptionData::getU_abi_cxx11_(data);
  std::__cxx11::string::substr((ulong)((long)&owner_data.field_2 + 8),(ulong)psVar2);
  psVar2 = QPDF::EncryptionData::getO_abi_cxx11_(data);
  std::__cxx11::string::substr((ulong)local_58,(ulong)psVar2);
  psVar2 = QPDF::EncryptionData::getO_abi_cxx11_(data);
  std::__cxx11::string::substr((ulong)((long)&password.field_2 + 8),(ulong)psVar2);
  truncate_password_V5((string *)local_a8,owner_password);
  hash_V5(&local_c8,(string *)local_a8,(string *)((long)&password.field_2 + 8),
          (string *)((long)&owner_data.field_2 + 8),data);
  _Var1 = std::operator==(&local_c8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(owner_data.field_2._M_local_buf + 8));
  return _Var1;
}

Assistant:

static bool
check_owner_password_V5(std::string const& owner_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.12 from the PDF 1.7 extension level 3

    std::string user_data = data.getU().substr(0, 48);
    std::string owner_data = data.getO().substr(0, 32);
    std::string validation_salt = data.getO().substr(32, 8);
    std::string password = truncate_password_V5(owner_password);
    return (hash_V5(password, validation_salt, user_data, data) == owner_data);
}